

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

bool __thiscall DepsLog::RecordId(DepsLog *this,Node *node)

{
  pointer *pppNVar1;
  iterator __position;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  uint uVar5;
  uint size;
  uint checksum;
  Node *local_28;
  uint local_20;
  uint local_1c;
  
  iVar2 = (int)(node->env_path_)._M_string_length;
  uVar5 = -iVar2 & 3;
  local_20 = iVar2 + uVar5 + 4;
  local_28 = node;
  if (local_20 < 0x80000) {
    sVar4 = fwrite(&local_20,4,1,(FILE *)this->file_);
    if (sVar4 != 0) {
      sVar4 = fwrite((local_28->env_path_)._M_dataplus._M_p,(long)iVar2,1,(FILE *)this->file_);
      if (sVar4 == 0) {
        if ((local_28->env_path_)._M_string_length == 0) {
          __assert_fail("node->path().size() > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/deps_log.cc"
                        ,0x192,"bool DepsLog::RecordId(Node *)");
        }
      }
      else if ((uVar5 == 0) || (sVar4 = fwrite("",(ulong)uVar5,1,(FILE *)this->file_), sVar4 != 0))
      {
        uVar5 = (uint)((ulong)((long)(this->nodes_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->nodes_).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        local_1c = ~uVar5;
        sVar4 = fwrite(&local_1c,4,1,(FILE *)this->file_);
        if ((sVar4 != 0) && (iVar2 = fflush((FILE *)this->file_), iVar2 == 0)) {
          local_28->id_ = uVar5;
          __position._M_current =
               (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&this->nodes_,__position,&local_28);
          }
          else {
            *__position._M_current = local_28;
            pppNVar1 = &(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
          }
          return true;
        }
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x22;
  }
  return false;
}

Assistant:

bool DepsLog::RecordId(Node* node) {
  int path_size = node->path().size();
  int padding = (4 - path_size % 4) % 4;  // Pad path to 4 byte boundary.

  unsigned size = path_size + padding + 4;
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  if (fwrite(node->path().data(), path_size, 1, file_) < 1) {
    assert(node->path().size() > 0);
    return false;
  }
  if (padding && fwrite("\0\0", padding, 1, file_) < 1)
    return false;
  int id = nodes_.size();
  unsigned checksum = ~(unsigned)id;
  if (fwrite(&checksum, 4, 1, file_) < 1)
    return false;
  if (fflush(file_) != 0)
    return false;

  node->set_id(id);
  nodes_.push_back(node);

  return true;
}